

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::TreeNode>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::TreeNode> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<(anonymous_namespace)::TreeNode> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  Int IVar4;
  long lVar5;
  TreeNode *__dest;
  long lVar6;
  int in_register_00000034;
  ulong uVar7;
  long lVar8;
  qsizetype toCopy;
  qsizetype qVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  uVar7 = CONCAT44(in_register_00000034,where);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (pQVar1 == (QArrayData *)0x0) {
    lVar5 = 0;
    lVar6 = this->size;
    if (this->size < 1) {
      lVar6 = lVar5;
    }
    lVar6 = lVar6 + uVar7;
  }
  else {
    if ((uVar7 != 0 && -1 < in_register_00000034) &&
       ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
      auVar10 = QArrayData::reallocateUnaligned
                          (pQVar1,this->ptr,0x28,
                           uVar7 + this->size +
                           ((long)((long)this->ptr -
                                  ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3)
                           * -0x3333333333333333,Grow);
      this->d = (Data *)auVar10._0_8_;
      this->ptr = (TreeNode *)auVar10._8_8_;
      goto LAB_003efcb6;
    }
    lVar5 = pQVar1->alloc;
    lVar6 = this->size;
    lVar8 = lVar5;
    if (lVar5 < lVar6) {
      lVar8 = lVar6;
    }
    lVar8 = (uVar7 - lVar5) + lVar6 +
            ((long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0))
            >> 3) * -0x3333333333333333 + lVar8;
    lVar6 = lVar8;
    if (lVar8 < lVar5) {
      lVar6 = lVar5;
    }
    if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar6 = lVar8;
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  __dest = (TreeNode *)QArrayData::allocate(&local_38,0x28,0x10,lVar6,(uint)(lVar6 <= lVar5));
  pQVar1 = local_38;
  if (__dest != (TreeNode *)0x0 && local_38 != (QArrayData *)0x0) {
    pDVar2 = this->d;
    if (pDVar2 == (Data *)0x0) {
      IVar4 = 0;
    }
    else {
      __dest = (TreeNode *)
               ((long)__dest +
               ((long)this->ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)));
      IVar4 = (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>
              .super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar4;
  }
  if ((this->size == 0) ||
     (qVar9 = this->size + ((long)in_register_00000034 >> 0x1f & uVar7), qVar9 == 0)) {
    qVar9 = 0;
  }
  else {
    memcpy(__dest,this->ptr,qVar9 * 0x28);
  }
  pQVar3 = &this->d->super_QArrayData;
  this->d = (Data *)pQVar1;
  this->ptr = __dest;
  this->size = qVar9;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x28,0x10);
    }
  }
LAB_003efcb6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }